

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FactorTimer.h
# Opt level: O1

void __thiscall
FactorTimer::reportFactorClockList
          (FactorTimer *this,char *grepStamp,HighsTimerClock *factor_timer_clock,
          vector<int,_std::allocator<int>_> *factor_clock_list)

{
  HighsTimer *this_00;
  pointer piVar1;
  vector<int,_std::allocator<int>_> *__nbytes;
  pointer extraout_RDX;
  pointer __buf;
  void *__buf_00;
  void *__buf_01;
  ulong uVar2;
  uint uVar3;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  vector<int,_std::allocator<int>_> clockList;
  vector<int,_std::allocator<int>_> local_48;
  
  this_00 = factor_timer_clock->timer_pointer_;
  local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  uVar3 = (uint)((ulong)((long)(factor_clock_list->super__Vector_base<int,_std::allocator<int>_>).
                               _M_impl.super__Vector_impl_data._M_finish -
                        (long)(factor_clock_list->super__Vector_base<int,_std::allocator<int>_>).
                              _M_impl.super__Vector_impl_data._M_start) >> 2);
  __nbytes = factor_clock_list;
  std::vector<int,_std::allocator<int>_>::resize(&local_48,(long)(int)uVar3);
  __buf = extraout_RDX;
  if (0 < (int)uVar3) {
    piVar1 = (factor_clock_list->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    __nbytes = (vector<int,_std::allocator<int>_> *)
               (factor_timer_clock->clock_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
    uVar2 = 0;
    do {
      local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[uVar2] =
           *(int *)((long)&(__nbytes->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                           super__Vector_impl_data._M_start + (long)piVar1[uVar2] * 4);
      uVar2 = uVar2 + 1;
      __buf = local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start;
    } while ((uVar3 & 0x7fffffff) != uVar2);
  }
  HighsTimer::read(this_00,*(factor_timer_clock->clock_).
                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start,__buf,(size_t)__nbytes);
  HighsTimer::read(this_00,(factor_timer_clock->clock_).
                           super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start[5],__buf_00,(size_t)__nbytes);
  HighsTimer::read(this_00,(factor_timer_clock->clock_).
                           super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start[0x19],__buf_01,(size_t)__nbytes);
  HighsTimer::reportOnTolerance
            (this_00,grepStamp,&local_48,
             extraout_XMM0_Qa + 0.0 + extraout_XMM0_Qa_00 + extraout_XMM0_Qa_01,1e-08);
  if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void reportFactorClockList(const char* grepStamp,
                             HighsTimerClock& factor_timer_clock,
                             std::vector<HighsInt> factor_clock_list) {
    HighsTimer* timer_pointer = factor_timer_clock.timer_pointer_;
    std::vector<HighsInt>& clock = factor_timer_clock.clock_;
    HighsInt factor_clock_list_size = factor_clock_list.size();
    std::vector<HighsInt> clockList;
    clockList.resize(factor_clock_list_size);
    for (HighsInt en = 0; en < factor_clock_list_size; en++) {
      clockList[en] = clock[factor_clock_list[en]];
    }
    double ideal_sum_time = 0;
    ideal_sum_time += timer_pointer->read(clock[FactorInvert]);
    ideal_sum_time += timer_pointer->read(clock[FactorFtran]);
    ideal_sum_time += timer_pointer->read(clock[FactorBtran]);
    timer_pointer->reportOnTolerance(grepStamp, clockList, ideal_sum_time,
                                     1e-8);
  }